

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli_bit_stream.cpp
# Opt level: O0

void InitBlockEncoder(BlockEncoder *self,size_t histogram_length,size_t num_block_types,
                     uint8_t *block_types,uint32_t *block_lengths,size_t num_blocks)

{
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  uint *in_R8;
  long in_R9;
  uint local_34;
  
  *in_RDI = in_RSI;
  in_RDI[1] = in_RDX;
  in_RDI[2] = in_RCX;
  in_RDI[3] = in_R8;
  in_RDI[4] = in_R9;
  InitBlockTypeCodeCalculator((BlockTypeCodeCalculator *)(in_RDI + 5));
  in_RDI[0x72] = 0;
  if (in_R9 == 0) {
    local_34 = 0;
  }
  else {
    local_34 = *in_R8;
  }
  in_RDI[0x73] = (ulong)local_34;
  in_RDI[0x74] = 0;
  in_RDI[0x75] = 0;
  in_RDI[0x76] = 0;
  return;
}

Assistant:

static void InitBlockEncoder(BlockEncoder* self, size_t histogram_length,
    size_t num_block_types, const uint8_t* block_types,
    const uint32_t* block_lengths, const size_t num_blocks) {
  self->histogram_length_ = histogram_length;
  self->num_block_types_ = num_block_types;
  self->block_types_ = block_types;
  self->block_lengths_ = block_lengths;
  self->num_blocks_ = num_blocks;
  InitBlockTypeCodeCalculator(&self->block_split_code_.type_code_calculator);
  self->block_ix_ = 0;
  self->block_len_ = num_blocks == 0 ? 0 : block_lengths[0];
  self->entropy_ix_ = 0;
  self->depths_ = 0;
  self->bits_ = 0;
}